

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lazy.h
# Opt level: O0

void __thiscall
async_simple::coro::detail::LazyPromise<void>::unhandled_exception(LazyPromise<void> *this)

{
  exception_ptr *in_RDI;
  exception_ptr *unaff_retaddr;
  exception_ptr *in_stack_fffffffffffffff0;
  
  std::current_exception();
  std::__exception_ptr::exception_ptr::operator=(unaff_retaddr,in_RDI);
  std::__exception_ptr::exception_ptr::~exception_ptr(in_stack_fffffffffffffff0);
  return;
}

Assistant:

void unhandled_exception() noexcept {
        _exception = std::current_exception();
    }